

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

void xmlHashFree(xmlHashTablePtr table,xmlHashDeallocator f)

{
  _xmlHashEntry *p_Var1;
  bool bVar2;
  int local_38;
  int nbElems;
  int inside_table;
  xmlHashEntryPtr next;
  xmlHashEntryPtr iter;
  int i;
  xmlHashDeallocator f_local;
  xmlHashTablePtr table_local;
  
  if (table != (xmlHashTablePtr)0x0) {
    if (table->table != (_xmlHashEntry *)0x0) {
      local_38 = table->nbElems;
      for (iter._4_4_ = 0; iter._4_4_ < table->size && 0 < local_38; iter._4_4_ = iter._4_4_ + 1) {
        if (table->table[iter._4_4_].valid != 0) {
          bVar2 = true;
          next = table->table + iter._4_4_;
          while (next != (xmlHashEntryPtr)0x0) {
            p_Var1 = next->next;
            if ((f != (xmlHashDeallocator)0x0) && (next->payload != (void *)0x0)) {
              (*f)(next->payload,next->name);
            }
            if (table->dict == (xmlDictPtr)0x0) {
              if (next->name != (xmlChar *)0x0) {
                (*xmlFree)(next->name);
              }
              if (next->name2 != (xmlChar *)0x0) {
                (*xmlFree)(next->name2);
              }
              if (next->name3 != (xmlChar *)0x0) {
                (*xmlFree)(next->name3);
              }
            }
            next->payload = (void *)0x0;
            if (!bVar2) {
              (*xmlFree)(next);
            }
            local_38 = local_38 + -1;
            bVar2 = false;
            next = p_Var1;
          }
        }
      }
      (*xmlFree)(table->table);
    }
    if (table->dict != (xmlDictPtr)0x0) {
      xmlDictFree(table->dict);
    }
    (*xmlFree)(table);
  }
  return;
}

Assistant:

void
xmlHashFree(xmlHashTablePtr table, xmlHashDeallocator f) {
    int i;
    xmlHashEntryPtr iter;
    xmlHashEntryPtr next;
    int inside_table = 0;
    int nbElems;

    if (table == NULL)
	return;
    if (table->table) {
	nbElems = table->nbElems;
	for(i = 0; (i < table->size) && (nbElems > 0); i++) {
	    iter = &(table->table[i]);
	    if (iter->valid == 0)
		continue;
	    inside_table = 1;
	    while (iter) {
		next = iter->next;
		if ((f != NULL) && (iter->payload != NULL))
		    f(iter->payload, iter->name);
		if (table->dict == NULL) {
		    if (iter->name)
			xmlFree(iter->name);
		    if (iter->name2)
			xmlFree(iter->name2);
		    if (iter->name3)
			xmlFree(iter->name3);
		}
		iter->payload = NULL;
		if (!inside_table)
		    xmlFree(iter);
		nbElems--;
		inside_table = 0;
		iter = next;
	    }
	}
	xmlFree(table->table);
    }
    if (table->dict)
        xmlDictFree(table->dict);
    xmlFree(table);
}